

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpgen.cpp
# Opt level: O0

void __thiscall cp::cpgen::setup(cpgen *this,double t,double sst,double dst,double cogh,double legh)

{
  double legh_local;
  double cogh_local;
  double dst_local;
  double sst_local;
  double t_local;
  cpgen *this_local;
  
  *(double *)(this + 0x850) = t;
  *(double *)(this + 0x858) = sst;
  *(double *)(this + 0x860) = dst;
  *(double *)(this + 0x868) = cogh;
  *(double *)(this + 0x870) = legh;
  CoMTrack::setup((CoMTrack *)this,*(double *)(this + 0x850),*(double *)(this + 0x858),
                  *(double *)(this + 0x860),*(double *)(this + 0x868));
  LegTrack::setup((LegTrack *)(this + 0x80),*(double *)(this + 0x850),*(double *)(this + 0x858),
                  *(double *)(this + 0x860),*(double *)(this + 0x870));
  return;
}

Assistant:

void cpgen::setup(double t, double sst, double dst, double cogh, double legh) {
  dt = t;
  single_sup_time = sst;
  double_sup_time = dst;
  cog_h = cogh;
  leg_h = legh;

  comtrack.setup(dt, single_sup_time, double_sup_time, cog_h);
  legtrack.setup(dt, single_sup_time, double_sup_time, leg_h);
}